

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_text.c
# Opt level: O1

void text_setto(t_text *x,_glist *glist,char *buf,int bufsize)

{
  short sVar1;
  short sVar2;
  short sVar3;
  t_pd *pp_Var4;
  int iVar5;
  int iVar6;
  int iVar7;
  _glist *in_RAX;
  _glist *p_Var8;
  undefined4 extraout_var;
  _binbuf *x_00;
  t_atom *ptVar9;
  t_atom *ptVar10;
  undefined4 extraout_var_00;
  _glist *p_Var11;
  void *pvVar12;
  _glist *x_01;
  t_symbol *ptVar13;
  t_gotfn p_Var14;
  
  p_Var8 = glist_getcanvas(in_RAX);
  iVar5 = glist_getindex(p_Var8,&x->te_g);
  p_Var8 = (_glist *)
           (CONCAT71((int7)(CONCAT44(extraout_var,iVar5) >> 8),x->field_0x2e) & 0xffffffffffffff03);
  if ((char)p_Var8 != '\x01') {
    p_Var8 = glist_getcanvas(p_Var8);
    p_Var11 = glist_getcanvas(p_Var8);
    pvVar12 = canvas_undo_set_recreate(p_Var11,&x->te_g,iVar5);
    canvas_undo_add(p_Var8,UNDO_RECREATE,"recreate",pvVar12);
    binbuf_text(x->te_binbuf,buf,(long)bufsize);
    return;
  }
  x_00 = binbuf_new();
  sVar1 = x->te_width;
  binbuf_text(x_00,buf,(long)bufsize);
  iVar6 = binbuf_getnatom(x->te_binbuf);
  ptVar9 = binbuf_getvec(x->te_binbuf);
  iVar7 = binbuf_getnatom(x_00);
  ptVar10 = binbuf_getvec(x_00);
  if ((0 < iVar7 && 0 < iVar6) && (ptVar9->a_type == A_SYMBOL)) {
    iVar6 = strcmp(((ptVar9->a_w).w_symbol)->s_name,"pd");
    if ((iVar6 == 0) && (ptVar10->a_type == A_SYMBOL)) {
      iVar6 = strcmp(((ptVar10->a_w).w_symbol)->s_name,"pd");
      if (iVar6 == 0) {
        p_Var8 = glist_getcanvas((_glist *)CONCAT44(extraout_var_00,iVar6));
        p_Var11 = glist_getcanvas(p_Var8);
        pvVar12 = canvas_undo_set_recreate(p_Var11,&x->te_g,iVar5);
        canvas_undo_add(p_Var8,UNDO_RECREATE,"recreate",pvVar12);
        ptVar13 = gensym("rename");
        pd_typedmess((t_pd *)x,ptVar13,iVar7 + -1,ptVar10 + 1);
        binbuf_free(x->te_binbuf);
        x->te_binbuf = x_00;
        goto LAB_0015f979;
      }
    }
  }
  sVar2 = x->te_xpix;
  sVar3 = x->te_ypix;
  p_Var8 = glist_getcanvas((_glist *)(ulong)(uint)(int)sVar2);
  p_Var11 = glist_getcanvas(p_Var8);
  pvVar12 = canvas_undo_set_recreate(p_Var11,&x->te_g,iVar5);
  canvas_undo_add(p_Var8,UNDO_RECREATE,"recreate",pvVar12);
  glist_delete(glist,&x->te_g);
  canvas_objtext(glist,(int)sVar2,(int)sVar3,(int)sVar1,0,x_00);
  p_Var8 = glist_getcanvas(x_01);
  canvas_restoreconnections(p_Var8);
  pp_Var4 = pd_maininstance.pd_newest;
  if (pd_maininstance.pd_newest != (t_pd *)0x0) {
    if (*pd_maininstance.pd_newest == canvas_class) {
      canvas_loadbang((_glist *)pd_maininstance.pd_newest);
    }
    else {
      ptVar13 = gensym("loadbang");
      p_Var14 = zgetfn(pp_Var4,ptVar13);
      pp_Var4 = pd_maininstance.pd_newest;
      if (p_Var14 != (t_gotfn)0x0) {
        ptVar13 = gensym("loadbang");
        pd_vmess(pp_Var4,ptVar13,"f",0);
      }
    }
  }
LAB_0015f979:
  if ((0 < iVar7) && (ptVar10->a_type == A_SYMBOL)) {
    iVar5 = strcmp(((ptVar10->a_w).w_symbol)->s_name,"pd");
    if (iVar5 == 0) {
      canvas_updatewindowlist();
      return;
    }
  }
  return;
}

Assistant:

void text_setto(t_text *x, t_glist *glist, const char *buf, int bufsize)
{
    int pos = glist_getindex(glist_getcanvas(glist), &x->te_g);
    if (x->te_type == T_OBJECT)
    {
        t_binbuf *b = binbuf_new();
        int natom1, natom2, widthwas = x->te_width;
        t_atom *vec1, *vec2;
        binbuf_text(b, buf, bufsize);
        natom1 = binbuf_getnatom(x->te_binbuf);
        vec1 = binbuf_getvec(x->te_binbuf);
        natom2 = binbuf_getnatom(b);
        vec2 = binbuf_getvec(b);
            /* special case: if  pd args change just pass the message on. */
        if (natom1 >= 1 && natom2 >= 1 && vec1[0].a_type == A_SYMBOL
            && !strcmp(vec1[0].a_w.w_symbol->s_name, "pd") &&
             vec2[0].a_type == A_SYMBOL
            && !strcmp(vec2[0].a_w.w_symbol->s_name, "pd"))
        {
            canvas_undo_add(glist_getcanvas(glist), UNDO_RECREATE, "recreate",
                (void *)canvas_undo_set_recreate(glist_getcanvas(glist),
                &x->te_g, pos));

            typedmess(&x->te_pd, gensym("rename"), natom2-1, vec2+1);
            binbuf_free(x->te_binbuf);
            x->te_binbuf = b;
        }
        else  /* normally, just destroy the old one and make a new one. */
        {
            int xwas = x->te_xpix, ywas = x->te_ypix;
            canvas_undo_add(glist_getcanvas(glist), UNDO_RECREATE, "recreate",
                (void *)canvas_undo_set_recreate(glist_getcanvas(glist),
                &x->te_g, pos));
            glist_delete(glist, &x->te_g);
            canvas_objtext(glist, xwas, ywas, widthwas, 0, b);
            canvas_restoreconnections(glist_getcanvas(glist));
                /* if it's an abstraction loadbang it here */
            if (pd_this->pd_newest)
            {
                if (pd_class(pd_this->pd_newest) == canvas_class)
                    canvas_loadbang((t_canvas *)pd_this->pd_newest);
                else if (zgetfn(pd_this->pd_newest, gensym("loadbang")))
                    vmess(pd_this->pd_newest, gensym("loadbang"), "f", LB_LOAD);
            }
        }
            /* if we made a new "pd" or changed a window name,
                update window list */
        if (natom2 >= 1  && vec2[0].a_type == A_SYMBOL
            && !strcmp(vec2[0].a_w.w_symbol->s_name, "pd"))
                canvas_updatewindowlist();
    }
    else
    {
        canvas_undo_add(glist_getcanvas(glist), UNDO_RECREATE, "recreate",
           (void *)canvas_undo_set_recreate(glist_getcanvas(glist),
            &x->te_g, pos));
        binbuf_text(x->te_binbuf, buf, bufsize);

    }
}